

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracepoint_map.cpp
# Opt level: O2

MapInfo * __thiscall
HawkTracer::client::TracepointMap::get_label_info
          (MapInfo *__return_storage_ptr__,TracepointMap *this,uint64_t label)

{
  iterator iVar1;
  mapped_type *this_00;
  ostream *poVar2;
  Category category;
  unsigned_long local_18;
  
  local_18 = label;
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_18);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::__cxx11::to_string(&__return_storage_ptr__->label,local_18);
    category_to_string_abi_cxx11_(&__return_storage_ptr__->category,(TracepointMap *)0x0,category);
    this_00 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this,&local_18);
    MapInfo::operator=(this_00,__return_storage_ptr__);
    poVar2 = std::operator<<((ostream *)&std::cerr,"Cannot find mapping for label ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    MapInfo::MapInfo(__return_storage_ptr__,
                     (MapInfo *)
                     ((long)iVar1.
                            super__Node_iterator_base<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_false>
                            ._M_cur + 0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

TracepointMap::MapInfo TracepointMap::get_label_info(uint64_t label)
{
    auto it = _input_map.find(label);

    if (it != _input_map.end())
    {
        return it->second;
    }

    MapInfo info = { std::to_string(label), category_to_string(Unknown) };
    _input_map[label] = info;

    std::cerr << "Cannot find mapping for label " << label << std::endl;
    return info;
}